

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

shared_ptr<wallet::CWallet> __thiscall
wallet::GetWalletForJSONRPCRequest(wallet *this,JSONRPCRequest *request)

{
  size_t sVar1;
  bool bVar2;
  WalletContext *context;
  UniValue *pUVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_FS_OFFSET;
  shared_ptr<wallet::CWallet> sVar5;
  size_t count;
  string wallet_name;
  size_t local_80;
  string local_78;
  string local_58;
  long local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_dataplus._M_p._0_1_ = request->mode == EXECUTE;
  inline_check_non_fatal<bool>
            ((bool *)&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/util.cpp"
             ,0x4b,"GetWalletForJSONRPCRequest","request.mode == JSONRPCRequest::EXECUTE");
  context = EnsureWalletContext(&request->context);
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  bVar2 = GetWalletNameFromJSONRPCRequest(request,&local_58);
  if (bVar2) {
    sVar5 = GetWallet(this,context,&local_58);
    _Var4 = sVar5.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (*(long *)this == 0) {
      pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"Requested wallet does not exist or is not loaded","");
      JSONRPCError(pUVar3,-0x12,&local_78);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar3,&::UniValue::typeinfo,::UniValue::~UniValue);
      }
      goto LAB_0065ed99;
    }
  }
  else {
    local_80 = 0;
    sVar5 = GetDefaultWallet(this,context,&local_80);
    sVar1 = local_80;
    _Var4 = sVar5.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (*(long *)this == 0) {
      pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      if (sVar1 == 0) {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,
                   "No wallet is loaded. Load a wallet using loadwallet or create a new one with createwallet. (Note: A default wallet is no longer automatically created)"
                   ,"");
        JSONRPCError(pUVar3,-0x12,&local_78);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar3,&::UniValue::typeinfo,::UniValue::~UniValue);
        }
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,
                   "Wallet file not specified (must request wallet RPC through /wallet/<filename> uri-path)."
                   ,"");
        JSONRPCError(pUVar3,-0x13,&local_78);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar3,&::UniValue::typeinfo,::UniValue::~UniValue);
        }
      }
      goto LAB_0065ed99;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
    _Var4._M_pi = extraout_RDX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    sVar5.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var4._M_pi;
    sVar5.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<wallet::CWallet>)
           sVar5.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>;
  }
LAB_0065ed99:
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<CWallet> GetWalletForJSONRPCRequest(const JSONRPCRequest& request)
{
    CHECK_NONFATAL(request.mode == JSONRPCRequest::EXECUTE);
    WalletContext& context = EnsureWalletContext(request.context);

    std::string wallet_name;
    if (GetWalletNameFromJSONRPCRequest(request, wallet_name)) {
        std::shared_ptr<CWallet> pwallet = GetWallet(context, wallet_name);
        if (!pwallet) throw JSONRPCError(RPC_WALLET_NOT_FOUND, "Requested wallet does not exist or is not loaded");
        return pwallet;
    }

    size_t count{0};
    auto wallet = GetDefaultWallet(context, count);
    if (wallet) return wallet;

    if (count == 0) {
        throw JSONRPCError(
            RPC_WALLET_NOT_FOUND, "No wallet is loaded. Load a wallet using loadwallet or create a new one with createwallet. (Note: A default wallet is no longer automatically created)");
    }
    throw JSONRPCError(RPC_WALLET_NOT_SPECIFIED,
        "Wallet file not specified (must request wallet RPC through /wallet/<filename> uri-path).");
}